

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  IConfig *pIVar4;
  long in_RSI;
  ConsoleReporter *in_RDI;
  AssertionPrinter printer;
  bool printInfoMessages;
  AssertionResult *result;
  undefined1 in_stack_ffffffffffffff5f;
  AssertionStats *in_stack_ffffffffffffff60;
  ostream *in_stack_ffffffffffffff68;
  AssertionPrinter *in_stack_ffffffffffffff70;
  bool local_1;
  
  pIVar4 = Ptr<Catch::IConfig>::operator->(&(in_RDI->super_StreamingReporterBase).m_config);
  uVar2 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  if ((((uVar2 & 1) == 0) && (bVar1 = AssertionResult::isOk((AssertionResult *)in_RDI), bVar1)) &&
     (OVar3 = AssertionResult::getResultType((AssertionResult *)(in_RSI + 8)), OVar3 != Warning)) {
    local_1 = false;
  }
  else {
    lazyPrint(in_RDI);
    AssertionPrinter::AssertionPrinter
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
               (bool)in_stack_ffffffffffffff5f);
    AssertionPrinter::print((AssertionPrinter *)in_RDI);
    std::ostream::operator<<
              ((in_RDI->super_StreamingReporterBase).stream,std::endl<char,std::char_traits<char>>);
    local_1 = true;
    AssertionPrinter::~AssertionPrinter((AssertionPrinter *)in_RDI);
  }
  return local_1;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            lazyPrint();

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();
            stream << std::endl;
            return true;
        }